

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

int rlbot::Interface::SendQuickChat(QuickChatSelection message,int botIndex,bool teamOnly)

{
  code *pcVar1;
  Offset<rlbot::flat::QuickChat> root;
  uoffset_t uVar2;
  int iVar3;
  size_t buffer_minalign;
  uint8_t *puVar4;
  undefined1 local_78 [4];
  Offset<rlbot::flat::QuickChat> quickChatOffset;
  FlatBufferBuilder builder;
  bool teamOnly_local;
  int botIndex_local;
  QuickChatSelection message_local;
  
  buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder
            ((FlatBufferBuilder *)local_78,0x32,(Allocator *)0x0,false,buffer_minalign);
  root = flat::CreateQuickChat((FlatBufferBuilder *)local_78,message,botIndex,teamOnly,0,0.0);
  flatbuffers::FlatBufferBuilder::Finish<rlbot::flat::QuickChat>
            ((FlatBufferBuilder *)local_78,root,(char *)0x0);
  pcVar1 = _sendQuickChat;
  puVar4 = flatbuffers::FlatBufferBuilder::GetBufferPointer((FlatBufferBuilder *)local_78);
  uVar2 = flatbuffers::FlatBufferBuilder::GetSize((FlatBufferBuilder *)local_78);
  iVar3 = (*pcVar1)(puVar4,uVar2);
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder((FlatBufferBuilder *)local_78);
  return iVar3;
}

Assistant:

int Interface::SendQuickChat(rlbot::flat::QuickChatSelection message,
                             int botIndex, bool teamOnly) {
  flatbuffers::FlatBufferBuilder builder(50);

  auto quickChatOffset =
      rlbot::flat::CreateQuickChat(builder, message, botIndex, teamOnly);
  builder.Finish(quickChatOffset);

  return _sendQuickChat(builder.GetBufferPointer(), builder.GetSize());
}